

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall
Chainstate::PreciousBlock(Chainstate *this,BlockValidationState *state,CBlockIndex *pindex)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  Chainstate *this_00;
  long in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock26;
  shared_ptr<const_CBlock> *in_stack_000000e0;
  BlockValidationState *in_stack_000000e8;
  Chainstate *in_stack_000000f0;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
  *in_stack_ffffffffffffff28;
  CBlockIndex *in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff3b;
  int in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff40;
  undefined2 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4a;
  undefined1 in_stack_ffffffffffffff4b;
  undefined4 in_stack_ffffffffffffff4c;
  int iVar4;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  byte local_41;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            ((char *)in_stack_ffffffffffffff28,
             (char *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c,(Mutex *)0x149a82e);
  AssertLockNotHeldInline
            ((char *)in_stack_ffffffffffffff28,
             (char *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c,(RecursiveMutex *)0x149a850);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),in_stack_ffffffffffffff50
             ,(char *)CONCAT44(in_stack_ffffffffffffff4c,
                               CONCAT13(in_stack_ffffffffffffff4b,
                                        CONCAT12(in_stack_ffffffffffffff4a,in_stack_ffffffffffffff48
                                                ))),in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff3c,(bool)in_stack_ffffffffffffff3b);
  CChain::Tip((CChain *)in_stack_ffffffffffffff28);
  bVar2 = ::operator<((base_uint<256U> *)in_stack_ffffffffffffff28,
                      (base_uint<256U> *)
                      CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  if (bVar2) {
    local_41 = 1;
    bVar2 = true;
  }
  else {
    CChain::Tip((CChain *)in_stack_ffffffffffffff28);
    bVar2 = operator>((base_uint<256U> *)in_stack_ffffffffffffff28,
                      (base_uint<256U> *)
                      CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    if (bVar2) {
      *(undefined4 *)(*(long *)(in_RDI + 0x50) + 0xc90) = 0xffffffff;
    }
    this_00 = (Chainstate *)CChain::Tip((CChain *)in_stack_ffffffffffffff28);
    arith_uint256::operator=
              ((arith_uint256 *)in_stack_ffffffffffffff28,
               (arith_uint256 *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::erase
              (in_stack_ffffffffffffff28,
               (key_type *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
    *(undefined4 *)(in_RDX + 0x8c) = *(undefined4 *)(*(long *)(in_RDI + 0x50) + 0xc90);
    iVar4 = *(int *)(*(long *)(in_RDI + 0x50) + 0xc90);
    iVar3 = std::numeric_limits<int>::min();
    if (iVar3 < iVar4) {
      *(int *)(*(long *)(in_RDI + 0x50) + 0xc90) = *(int *)(*(long *)(in_RDI + 0x50) + 0xc90) + -1;
    }
    bVar2 = CBlockIndex::IsValid
                      (in_stack_ffffffffffffff30,
                       (BlockStatus)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    if ((bVar2) &&
       (bVar2 = CBlockIndex::HaveNumChainTxs
                          ((CBlockIndex *)
                           CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)), bVar2)) {
      std::set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>::
      insert(in_stack_ffffffffffffff28,
             (value_type *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      PruneBlockIndexCandidates(this_00);
    }
    bVar2 = false;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if (!bVar2) {
    std::shared_ptr<const_CBlock>::shared_ptr
              ((shared_ptr<const_CBlock> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    local_41 = ActivateBestChain(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
    std::shared_ptr<const_CBlock>::~shared_ptr
              ((shared_ptr<const_CBlock> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(local_41 & 1);
}

Assistant:

bool Chainstate::PreciousBlock(BlockValidationState& state, CBlockIndex* pindex)
{
    AssertLockNotHeld(m_chainstate_mutex);
    AssertLockNotHeld(::cs_main);
    {
        LOCK(cs_main);
        if (pindex->nChainWork < m_chain.Tip()->nChainWork) {
            // Nothing to do, this block is not at the tip.
            return true;
        }
        if (m_chain.Tip()->nChainWork > m_chainman.nLastPreciousChainwork) {
            // The chain has been extended since the last call, reset the counter.
            m_chainman.nBlockReverseSequenceId = -1;
        }
        m_chainman.nLastPreciousChainwork = m_chain.Tip()->nChainWork;
        setBlockIndexCandidates.erase(pindex);
        pindex->nSequenceId = m_chainman.nBlockReverseSequenceId;
        if (m_chainman.nBlockReverseSequenceId > std::numeric_limits<int32_t>::min()) {
            // We can't keep reducing the counter if somebody really wants to
            // call preciousblock 2**31-1 times on the same set of tips...
            m_chainman.nBlockReverseSequenceId--;
        }
        if (pindex->IsValid(BLOCK_VALID_TRANSACTIONS) && pindex->HaveNumChainTxs()) {
            setBlockIndexCandidates.insert(pindex);
            PruneBlockIndexCandidates();
        }
    }

    return ActivateBestChain(state, std::shared_ptr<const CBlock>());
}